

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

void Abc_NtkFinLocalSetdown(Vec_Int_t *vPairs,Vec_Int_t *vList,Vec_Wec_t *vMap2)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  
  if (0 < vList->nSize) {
    piVar2 = vList->pArray;
    lVar4 = 0;
    do {
      if ((piVar2[lVar4] < 0) || (uVar3 = piVar2[lVar4] * 2, vPairs->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = vPairs->pArray[uVar3];
      if (((long)iVar1 < 0) || (vMap2->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      vMap2->pArray[iVar1].nSize = 0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vList->nSize);
  }
  return;
}

Assistant:

void Abc_NtkFinLocalSetdown( Vec_Int_t * vPairs, Vec_Int_t * vList, Vec_Wec_t * vMap2 )
{
    int i, iFin;
    Vec_IntForEachEntry( vList, iFin, i )
    {
        int iObj = Vec_IntEntry( vPairs, 2*iFin );
        Vec_Int_t * vArray = Vec_WecEntry( vMap2, iObj );
        Vec_IntClear( vArray );
    }
}